

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProductTest.cpp
# Opt level: O0

void __thiscall CardProdGetView::test_method(CardProdGetView *this)

{
  undefined8 uVar1;
  bool bVar2;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar3;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  lazy_ostream *plVar4;
  basic_cstring<const_char> local_9b0;
  basic_cstring<const_char> local_9a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_990;
  double local_970;
  RefVec local_968;
  Segment local_950;
  assertion_result local_918;
  basic_cstring<const_char> local_900;
  basic_cstring<const_char> local_8f0;
  basic_cstring<const_char> local_8e0;
  basic_cstring<const_char> local_8d0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_8c0;
  double local_8a0;
  RefVec local_898;
  Segment local_880;
  assertion_result local_848;
  basic_cstring<const_char> local_830;
  basic_cstring<const_char> local_820;
  basic_cstring<const_char> local_810;
  basic_cstring<const_char> local_800;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_7f0;
  double local_7d0;
  RefVec local_7c8;
  Segment local_7b0;
  assertion_result local_778;
  basic_cstring<const_char> local_760;
  basic_cstring<const_char> local_750;
  basic_cstring<const_char> local_740;
  basic_cstring<const_char> local_730;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_720;
  double local_700;
  RefVec local_6f8;
  Segment local_6e0;
  assertion_result local_6a8;
  basic_cstring<const_char> local_690;
  basic_cstring<const_char> local_680;
  basic_cstring<const_char> local_670;
  basic_cstring<const_char> local_660;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_650;
  double local_630;
  RefVec local_628;
  Segment local_610;
  assertion_result local_5d8;
  basic_cstring<const_char> local_5c0;
  basic_cstring<const_char> local_5b0;
  basic_cstring<const_char> local_5a0;
  basic_cstring<const_char> local_590;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_580;
  double local_560;
  RefVec local_558;
  Segment local_540;
  assertion_result local_508;
  basic_cstring<const_char> local_4f0;
  basic_cstring<const_char> local_4e0;
  Scalar local_4d0;
  Scalar local_4c8;
  CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_4c0;
  Scalar local_4a0;
  Scalar local_498;
  Scalar local_490;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_488;
  Scalar local_468;
  Scalar local_460;
  Scalar local_458;
  Scalar local_450;
  Scalar local_448;
  Scalar local_440;
  Scalar local_438;
  Scalar local_430;
  Scalar local_428;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_420;
  Scalar local_400;
  Scalar local_3f8;
  Scalar local_3f0;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_3e8;
  undefined1 local_3c8 [8];
  Vector2d xR2;
  undefined1 local_3b0 [8];
  VectorXd xSO3T;
  undefined1 local_398 [8];
  VectorXd xSO3;
  Vector3d xR3;
  Scalar local_368;
  Scalar local_360;
  Scalar local_358;
  Scalar local_350;
  Scalar local_348;
  Scalar local_340;
  Scalar local_338;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_330;
  int local_30c;
  undefined1 local_308 [8];
  VectorXd xT;
  Scalar local_2f0;
  Scalar local_2e8;
  Scalar local_2e0;
  Scalar local_2d8;
  Scalar local_2d0;
  Scalar local_2c8;
  Scalar local_2c0;
  Scalar local_2b8;
  Scalar local_2b0;
  Scalar local_2a8;
  Scalar local_2a0;
  Scalar local_298;
  Scalar local_290;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_288;
  int local_264;
  undefined1 local_260 [8];
  VectorXd x;
  CartesianProduct S;
  undefined1 local_1b0 [8];
  SO3<mnf::ExpMapMatrix> RotSpace;
  RealSpace local_100 [8];
  RealSpace R3;
  RealSpace local_88 [8];
  RealSpace R2;
  CardProdGetView *this_local;
  
  mnf::RealSpace::RealSpace(local_88,2);
  mnf::RealSpace::RealSpace(local_100,3);
  mnf::SO3<mnf::ExpMapMatrix>::SO3((SO3<mnf::ExpMapMatrix> *)local_1b0);
  mnf::CartesianProduct::CartesianProduct
            ((CartesianProduct *)
             &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             (Manifold *)local_100,(Manifold *)local_1b0);
  mnf::CartesianProduct::multiply
            ((Manifold *)
             &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  local_264 = 0xe;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_260,&local_264);
  local_290 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_288,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_260,&local_290);
  local_298 = 2.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_288,&local_298);
  local_2a0 = 3.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_2a0);
  local_2a8 = 4.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_2a8);
  local_2b0 = 5.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_2b0);
  local_2b8 = 6.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_2b8);
  local_2c0 = 7.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_2c0);
  local_2c8 = 8.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_2c8);
  local_2d0 = 9.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_2d0);
  local_2d8 = 10.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_2d8);
  local_2e0 = 11.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_2e0);
  local_2e8 = 12.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_2e8);
  local_2f0 = 13.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_2f0);
  xT.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       0x402c000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (pCVar3,(Scalar *)
                    &xT.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_rows);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_288);
  local_30c = 8;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_308,&local_30c);
  local_338 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_330,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_308,&local_338);
  local_340 = 2.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_330,&local_340);
  local_348 = 3.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_348);
  local_350 = 6.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_350);
  local_358 = 7.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_358);
  local_360 = 8.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_360);
  local_368 = 13.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_368);
  xR3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = 14.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
            (pCVar3,xR3.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array + 2);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_330);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             &xSO3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  xSO3T.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 9;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_398,
             (int *)((long)&xSO3T.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows + 4));
  xR2.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]._4_4_ =
       3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_3b0,
             (int *)((long)xR2.super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.
                           m_storage.m_data.array + 0xc));
  Eigen::Matrix<double,_2,_1,_0,_2,_1>::Matrix((Matrix<double,_2,_1,_0,_2,_1> *)local_3c8);
  local_3f0 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
            (&local_3e8,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             &xSO3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             &local_3f0);
  local_3f8 = 2.0;
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                      (&local_3e8,&local_3f8);
  local_400 = 3.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(this_00,&local_400);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_3e8);
  local_428 = 4.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_420,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_398,&local_428);
  local_430 = 5.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_420,&local_430);
  local_438 = 6.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_438);
  local_440 = 7.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_440);
  local_448 = 8.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_448);
  local_450 = 9.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_450);
  local_458 = 10.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_458);
  local_460 = 11.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (pCVar3,&local_460);
  local_468 = 12.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar3,&local_468);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_420);
  local_490 = 6.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_488,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3b0,&local_490);
  local_498 = 7.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_488,&local_498);
  local_4a0 = 8.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar3,&local_4a0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_488);
  local_4c8 = 13.0;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator<<
            (&local_4c0,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_3c8,&local_4c8);
  local_4d0 = 14.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_(&local_4c0,&local_4d0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::~CommaInitializer(&local_4c0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
               ,0x75);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4e0,0x221,&local_4f0);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_558,
               (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_260,(type *)0x0);
    mnf::Manifold::getView<0>
              (&local_540,
               (Manifold *)
               &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               &local_558,0);
    local_560 = Eigen::NumTraits<double>::dummy_precision();
    bVar2 = Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::
            isApprox<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                      ((DenseBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                       &xSO3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows,
                       (DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                        *)&local_540,&local_560);
    boost::test_tools::assertion_result::assertion_result(&local_508,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_590,"xR3.isApprox(S.getView<R>(x, 0))",0x20);
    boost::unit_test::operator<<(&local_580,plVar4,&local_590);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
               ,0x75);
    boost::test_tools::tt_detail::report_assertion(&local_508,&local_580,&local_5a0,0x221,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_580);
    boost::test_tools::assertion_result::~assertion_result(&local_508);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
               ,0x75);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5b0,0x222,&local_5c0);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_628,
               (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_260,(type *)0x0);
    mnf::Manifold::getView<0>
              (&local_610,
               (Manifold *)
               &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               &local_628,1);
    local_630 = Eigen::NumTraits<double>::dummy_precision();
    bVar2 = Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
            isApprox<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                      ((DenseBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_398,
                       (DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                        *)&local_610,&local_630);
    boost::test_tools::assertion_result::assertion_result(&local_5d8,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_660,"xSO3.isApprox(S.getView<R>(x, 1))",0x21);
    boost::unit_test::operator<<(&local_650,plVar4,&local_660);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_670,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
               ,0x75);
    boost::test_tools::tt_detail::report_assertion(&local_5d8,&local_650,&local_670,0x222,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_650);
    boost::test_tools::assertion_result::~assertion_result(&local_5d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_680,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
               ,0x75);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_690);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_680,0x223,&local_690);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_6f8,
               (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_260,(type *)0x0);
    mnf::Manifold::getView<0>
              (&local_6e0,
               (Manifold *)
               &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               &local_6f8,2);
    local_700 = Eigen::NumTraits<double>::dummy_precision();
    bVar2 = Eigen::DenseBase<Eigen::Matrix<double,2,1,0,2,1>>::
            isApprox<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                      ((DenseBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_3c8,
                       (DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                        *)&local_6e0,&local_700);
    boost::test_tools::assertion_result::assertion_result(&local_6a8,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_730,"xR2.isApprox(S.getView<R>(x, 2))",0x20);
    boost::unit_test::operator<<(&local_720,plVar4,&local_730);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_740,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
               ,0x75);
    boost::test_tools::tt_detail::report_assertion(&local_6a8,&local_720,&local_740,0x223,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_720);
    boost::test_tools::assertion_result::~assertion_result(&local_6a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_750,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
               ,0x75);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_760);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_750,0x224,&local_760);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_7c8,
               (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_308,(type *)0x0);
    mnf::Manifold::getView<1>
              (&local_7b0,
               (Manifold *)
               &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               &local_7c8,0);
    local_7d0 = Eigen::NumTraits<double>::dummy_precision();
    bVar2 = Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::
            isApprox<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                      ((DenseBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                       &xSO3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows,
                       (DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                        *)&local_7b0,&local_7d0);
    boost::test_tools::assertion_result::assertion_result(&local_778,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_800,"xR3.isApprox(S.getView<T>(xT, 0))",0x21);
    boost::unit_test::operator<<(&local_7f0,plVar4,&local_800);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_810,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
               ,0x75);
    boost::test_tools::tt_detail::report_assertion(&local_778,&local_7f0,&local_810,0x224,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_7f0);
    boost::test_tools::assertion_result::~assertion_result(&local_778);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_820,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
               ,0x75);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_830);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_820,0x225,&local_830);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_898,
               (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_308,(type *)0x0);
    mnf::Manifold::getView<1>
              (&local_880,
               (Manifold *)
               &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               &local_898,1);
    local_8a0 = Eigen::NumTraits<double>::dummy_precision();
    bVar2 = Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
            isApprox<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                      ((DenseBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_3b0,
                       (DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                        *)&local_880,&local_8a0);
    boost::test_tools::assertion_result::assertion_result(&local_848,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8d0,"xSO3T.isApprox(S.getView<T>(xT, 1))",0x23);
    boost::unit_test::operator<<(&local_8c0,plVar4,&local_8d0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
               ,0x75);
    boost::test_tools::tt_detail::report_assertion(&local_848,&local_8c0,&local_8e0,0x225,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_8c0);
    boost::test_tools::assertion_result::~assertion_result(&local_848);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_8f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
               ,0x75);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_900);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_8f0,0x226,&local_900);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>> *)&local_968,
               (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_308,(type *)0x0);
    mnf::Manifold::getView<1>
              (&local_950,
               (Manifold *)
               &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               &local_968,2);
    local_970 = Eigen::NumTraits<double>::dummy_precision();
    bVar2 = Eigen::DenseBase<Eigen::Matrix<double,2,1,0,2,1>>::
            isApprox<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
                      ((DenseBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_3c8,
                       (DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                        *)&local_950,&local_970);
    boost::test_tools::assertion_result::assertion_result(&local_918,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9a0,"xR2.isApprox(S.getView<T>(xT, 2))",0x21);
    boost::unit_test::operator<<(&local_990,plVar4,&local_9a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/CartesianProductTest.cpp"
               ,0x75);
    boost::test_tools::tt_detail::report_assertion(&local_918,&local_990,&local_9b0,0x226,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_990);
    boost::test_tools::assertion_result::~assertion_result(&local_918);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_3b0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_398);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_308);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_260);
  mnf::CartesianProduct::~CartesianProduct
            ((CartesianProduct *)
             &x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  mnf::SO3<mnf::ExpMapMatrix>::~SO3((SO3<mnf::ExpMapMatrix> *)local_1b0);
  mnf::RealSpace::~RealSpace(local_100);
  mnf::RealSpace::~RealSpace(local_88);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(CardProdGetView)
{
  RealSpace R2(2);
  RealSpace R3(3);
  SO3<ExpMapMatrix> RotSpace;
  CartesianProduct S(R3, RotSpace);
  S.multiply(R2);
  Eigen::VectorXd x(14);
  x << 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14;
  Eigen::VectorXd xT(8);
  xT << 1, 2, 3, 6, 7, 8, 13, 14;
  Eigen::Vector3d xR3;
  Eigen::VectorXd xSO3(9);
  Eigen::VectorXd xSO3T(3);
  Eigen::Vector2d xR2;
  xR3 << 1, 2, 3;
  xSO3 << 4, 5, 6, 7, 8, 9, 10, 11, 12;
  xSO3T << 6, 7, 8;
  xR2 << 13, 14;

  BOOST_CHECK(xR3.isApprox(S.getView<R>(x, 0)));
  BOOST_CHECK(xSO3.isApprox(S.getView<R>(x, 1)));
  BOOST_CHECK(xR2.isApprox(S.getView<R>(x, 2)));
  BOOST_CHECK(xR3.isApprox(S.getView<T>(xT, 0)));
  BOOST_CHECK(xSO3T.isApprox(S.getView<T>(xT, 1)));
  BOOST_CHECK(xR2.isApprox(S.getView<T>(xT, 2)));
}